

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tests.h
# Opt level: O0

bool density_tests::detail::
     PutUInt16<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>_>
     ::put(conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
           *queue,EasyRandom *param_2)

{
  unsigned_short *puVar1;
  unsigned_short local_5a;
  put_transaction<unsigned_short> local_58;
  undefined1 local_38 [8];
  put_transaction<unsigned_short> put;
  EasyRandom *param_1_local;
  conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
  *queue_local;
  
  local_5a = 0xf;
  put.m_queue = (conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
                 *)param_2;
  density::
  sp_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,density::default_busy_wait>
  ::start_emplace<unsigned_short,unsigned_short>
            (&local_58,
             (sp_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,density::default_busy_wait>
              *)queue,&local_5a);
  density::
  sp_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,density::default_busy_wait>
  ::put_transaction<unsigned_short>::put_transaction<unsigned_short,void>
            ((put_transaction<unsigned_short> *)local_38,&local_58);
  density::
  sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::put_transaction<unsigned_short>::~put_transaction(&local_58);
  puVar1 = density::
           sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
           ::put_transaction<unsigned_short>::element<unsigned_short,_nullptr>
                     ((put_transaction<unsigned_short> *)local_38);
  *puVar1 = *puVar1 + 1;
  exception_checkpoint();
  density::
  sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::put_transaction<unsigned_short>::commit((put_transaction<unsigned_short> *)local_38);
  density::
  sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::put_transaction<unsigned_short>::~put_transaction((put_transaction<unsigned_short> *)local_38);
  return true;
}

Assistant:

static bool put(QUEUE & queue, EasyRandom &)
            {
                auto put = queue.template start_emplace<uint16_t>(static_cast<uint16_t>(15));
                put.element() += 1;
                exception_checkpoint();
                put.commit(); // commit a 16. From now on, the element can be consumed
                return true;
            }